

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# array.h
# Opt level: O0

void __thiscall kj::ArrayBuilder<kj::OwnFd>::dispose(ArrayBuilder<kj::OwnFd> *this)

{
  OwnFd *firstElement;
  RemoveConst<kj::OwnFd> *pRVar1;
  OwnFd *pOVar2;
  OwnFd *endCopy;
  OwnFd *posCopy;
  OwnFd *ptrCopy;
  ArrayBuilder<kj::OwnFd> *this_local;
  
  firstElement = this->ptr;
  pRVar1 = this->pos;
  pOVar2 = this->endPtr;
  if (firstElement != (OwnFd *)0x0) {
    this->ptr = (OwnFd *)0x0;
    this->pos = (RemoveConst<kj::OwnFd> *)0x0;
    this->endPtr = (OwnFd *)0x0;
    ArrayDisposer::dispose<kj::OwnFd>
              (this->disposer,firstElement,(long)pRVar1 - (long)firstElement >> 2,
               (long)pOVar2 - (long)firstElement >> 2);
  }
  return;
}

Assistant:

inline void dispose() {
    // Make sure that if an exception is thrown, we are left with a null ptr, so we won't possibly
    // dispose again.
    T* ptrCopy = ptr;
    T* posCopy = pos;
    T* endCopy = endPtr;
    if (ptrCopy != nullptr) {
      ptr = nullptr;
      pos = nullptr;
      endPtr = nullptr;
      disposer->dispose(ptrCopy, posCopy - ptrCopy, endCopy - ptrCopy);
    }
  }